

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cryptor.cpp
# Opt level: O2

unique_ptr<Cryptor,_std::default_delete<Cryptor>_>
Cryptor::cryptor_factory(bool mode,Cryptors type,string *message)

{
  byte bVar1;
  _Alloc_hider _Var2;
  byte bVar3;
  pointer in_RAX;
  runtime_error *this;
  int iVar4;
  undefined7 in_register_00000039;
  __uniq_ptr_data<Cryptor,_std::default_delete<Cryptor>,_true,_true> _Var5;
  _Alloc_hider local_18;
  
  _Var5.super___uniq_ptr_impl<Cryptor,_std::default_delete<Cryptor>_>._M_t.
  super__Tuple_impl<0UL,_Cryptor_*,_std::default_delete<Cryptor>_>.
  super__Head_base<0UL,_Cryptor_*,_false>._M_head_impl._1_7_ = in_register_00000039;
  _Var5.super___uniq_ptr_impl<Cryptor,_std::default_delete<Cryptor>_>._M_t.
  super__Tuple_impl<0UL,_Cryptor_*,_std::default_delete<Cryptor>_>.
  super__Head_base<0UL,_Cryptor_*,_false>._M_head_impl._0_1_ = mode;
  bVar1 = (byte)type;
  bVar3 = bVar1 ^ 1;
  iVar4 = (int)message;
  local_18._M_p = in_RAX;
  if (iVar4 == 0 && bVar3 == 0) {
    std::make_unique<HuffmanEncoder,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffffe8);
    _Var2._M_p = local_18._M_p;
    local_18._M_p = (pointer)0x0;
    *(pointer *)
     _Var5.super___uniq_ptr_impl<Cryptor,_std::default_delete<Cryptor>_>._M_t.
     super__Tuple_impl<0UL,_Cryptor_*,_std::default_delete<Cryptor>_>.
     super__Head_base<0UL,_Cryptor_*,_false>._M_head_impl = _Var2._M_p;
    std::unique_ptr<HuffmanEncoder,_std::default_delete<HuffmanEncoder>_>::~unique_ptr
              ((unique_ptr<HuffmanEncoder,_std::default_delete<HuffmanEncoder>_> *)
               &stack0xffffffffffffffe8);
  }
  else if (iVar4 == 0 && bVar1 == 0) {
    std::make_unique<HuffmanDecoder,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffffe8);
    _Var2._M_p = local_18._M_p;
    local_18._M_p = (pointer)0x0;
    *(pointer *)
     _Var5.super___uniq_ptr_impl<Cryptor,_std::default_delete<Cryptor>_>._M_t.
     super__Tuple_impl<0UL,_Cryptor_*,_std::default_delete<Cryptor>_>.
     super__Head_base<0UL,_Cryptor_*,_false>._M_head_impl = _Var2._M_p;
    std::unique_ptr<HuffmanDecoder,_std::default_delete<HuffmanDecoder>_>::~unique_ptr
              ((unique_ptr<HuffmanDecoder,_std::default_delete<HuffmanDecoder>_> *)
               &stack0xffffffffffffffe8);
  }
  else if (iVar4 == 1 && bVar3 == 0) {
    std::make_unique<Lz77Encoder,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffffe8);
    _Var2._M_p = local_18._M_p;
    local_18._M_p = (pointer)0x0;
    *(pointer *)
     _Var5.super___uniq_ptr_impl<Cryptor,_std::default_delete<Cryptor>_>._M_t.
     super__Tuple_impl<0UL,_Cryptor_*,_std::default_delete<Cryptor>_>.
     super__Head_base<0UL,_Cryptor_*,_false>._M_head_impl = _Var2._M_p;
    std::unique_ptr<Lz77Encoder,_std::default_delete<Lz77Encoder>_>::~unique_ptr
              ((unique_ptr<Lz77Encoder,_std::default_delete<Lz77Encoder>_> *)
               &stack0xffffffffffffffe8);
  }
  else if (iVar4 == 1 && bVar1 == 0) {
    std::make_unique<Lz77Decoder,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffffe8);
    _Var2._M_p = local_18._M_p;
    local_18._M_p = (pointer)0x0;
    *(pointer *)
     _Var5.super___uniq_ptr_impl<Cryptor,_std::default_delete<Cryptor>_>._M_t.
     super__Tuple_impl<0UL,_Cryptor_*,_std::default_delete<Cryptor>_>.
     super__Head_base<0UL,_Cryptor_*,_false>._M_head_impl = _Var2._M_p;
    std::unique_ptr<Lz77Decoder,_std::default_delete<Lz77Decoder>_>::~unique_ptr
              ((unique_ptr<Lz77Decoder,_std::default_delete<Lz77Decoder>_> *)
               &stack0xffffffffffffffe8);
  }
  else {
    if (iVar4 == 2 && bVar3 == 0) {
      std::make_unique<DeflateEncoder,std::__cxx11::string_const&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffffe8);
    }
    else {
      if (iVar4 != 2 || bVar1 != 0) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Not implemented factory case");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::make_unique<DeflateDecoder,std::__cxx11::string_const&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffffe8);
    }
    *(pointer *)
     _Var5.super___uniq_ptr_impl<Cryptor,_std::default_delete<Cryptor>_>._M_t.
     super__Tuple_impl<0UL,_Cryptor_*,_std::default_delete<Cryptor>_>.
     super__Head_base<0UL,_Cryptor_*,_false>._M_head_impl = local_18._M_p;
  }
  return (__uniq_ptr_data<Cryptor,_std::default_delete<Cryptor>,_true,_true>)
         (tuple<Cryptor_*,_std::default_delete<Cryptor>_>)
         _Var5.super___uniq_ptr_impl<Cryptor,_std::default_delete<Cryptor>_>._M_t.
         super__Tuple_impl<0UL,_Cryptor_*,_std::default_delete<Cryptor>_>.
         super__Head_base<0UL,_Cryptor_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Cryptor> Cryptor::cryptor_factory(
  const bool mode,
  const Cryptors type,
  const std::string& message
) {
  if (mode &&
    type == Cryptors::Huffman) {
    return std::unique_ptr<Cryptor>(std::make_unique<HuffmanEncoder>(message));
  }
  if (!mode &&
    type == Cryptors::Huffman) {
    return std::unique_ptr<Cryptor>(std::make_unique<HuffmanDecoder>(message));
  }
  if (mode &&
    type == Cryptors::Lz77) {
    return std::unique_ptr<Cryptor>(std::make_unique<Lz77Encoder>(message));
  }
  if (!mode &&
    type == Cryptors::Lz77) {
    return std::unique_ptr<Cryptor>(std::make_unique<Lz77Decoder>(message));

  }
  if (mode &&
    type == Cryptors::Deflate) {
    return std::unique_ptr<Cryptor>(std::make_unique<DeflateEncoder>(message));
  }
  if (!mode &&
    type == Cryptors::Deflate) {
    return std::unique_ptr<Cryptor>(std::make_unique<DeflateDecoder>(message));
  }

  throw runtime_error("Not implemented factory case");
}